

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void threadFunc(void)

{
  LogStream *this;
  Logger local_fe8;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    Logger::Logger(&local_fe8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/tests/LoggingTest.cpp"
                   ,0x10);
    this = Logger::stream(&local_fe8);
    LogStream::operator<<(this,local_c);
    Logger::~Logger(&local_fe8);
  }
  return;
}

Assistant:

void threadFunc()
{
    for (int i = 0; i < 100000; ++i)
    {
        LOG << i;
    }
}